

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::AddDeprecatedFlag
          (FieldGeneratorBase *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  long lVar2;
  _func_void_FieldDescriptor_ptr *local_30;
  FieldDescriptor *local_28;
  
  pFVar1 = this->descriptor_;
  if (*(char *)(*(long *)(pFVar1 + 0x78) + 0x4e) == '\x01') {
    io::Printer::Print<>(printer,"[global::System.ObsoleteAttribute]\n");
    return;
  }
  if (*(once_flag **)(pFVar1 + 0x30) != (once_flag *)0x0) {
    local_30 = google::protobuf::FieldDescriptor::TypeOnceInit;
    local_28 = pFVar1;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar1 + 0x30),&local_30,&local_28);
  }
  if (*(int *)(pFVar1 + 0x38) == 0xb) {
    lVar2 = google::protobuf::FieldDescriptor::message_type();
    if (*(char *)(*(long *)(lVar2 + 0x20) + 0x4a) == '\x01') {
      io::Printer::Print<>(printer,"[global::System.ObsoleteAttribute]\n");
    }
  }
  return;
}

Assistant:

void FieldGeneratorBase::AddDeprecatedFlag(io::Printer* printer) {
  if (descriptor_->options().deprecated()) {
    printer->Print("[global::System.ObsoleteAttribute]\n");
  } else if (descriptor_->type() == FieldDescriptor::TYPE_MESSAGE &&
           descriptor_->message_type()->options().deprecated()) {
    printer->Print("[global::System.ObsoleteAttribute]\n");
  }
}